

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecificStrategy.cpp
# Opt level: O0

Stats * __thiscall
SpecificStrategy::extractStats(Stats *__return_storage_ptr__,SpecificStrategy *this,Info *info)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  size_type sVar4;
  reference pCVar5;
  undefined1 local_80 [8];
  Call call;
  iterator __end1;
  iterator __begin1;
  set<CfgData::Call,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_> *__range1;
  Info *info_local;
  SpecificStrategy *this_local;
  Stats *s;
  
  Stats::Stats(__return_storage_ptr__);
  sVar2 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::size
                    (&info->instrs);
  __return_storage_ptr__->instrs = (int)sVar2;
  sVar3 = std::set<CfgData::Node,_std::less<CfgData::Node>,_std::allocator<CfgData::Node>_>::size
                    (&(info->blocks).perfect);
  (__return_storage_ptr__->blocks).perfect = (int)sVar3;
  sVar3 = std::set<CfgData::Node,_std::less<CfgData::Node>,_std::allocator<CfgData::Node>_>::size
                    (&(info->blocks).conflict);
  (__return_storage_ptr__->blocks).conflict = (int)sVar3;
  sVar2 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::size
                    (&info->phantoms);
  __return_storage_ptr__->phantoms = __return_storage_ptr__->phantoms + (int)sVar2;
  sVar4 = std::set<CfgData::Edge,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_>::size
                    ((set<CfgData::Edge,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_> *
                     )&info->edges);
  (__return_storage_ptr__->edges).internal.perfect = (int)sVar4;
  sVar4 = std::set<CfgData::Edge,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_>::size
                    (&(info->edges).internal.conflict);
  (__return_storage_ptr__->edges).internal.conflict = (int)sVar4;
  sVar4 = std::set<CfgData::Edge,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_>::size
                    (&(info->edges).external.perfect);
  (__return_storage_ptr__->edges).external.perfect = (int)sVar4;
  sVar4 = std::set<CfgData::Edge,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_>::size
                    (&(info->edges).external.conflict);
  (__return_storage_ptr__->edges).external.conflict = (int)sVar4;
  __return_storage_ptr__->calls = 0;
  __end1 = std::set<CfgData::Call,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_>::begin
                     (&info->calls);
  call.calls._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)std::set<CfgData::Call,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_>::
               end(&info->calls);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&call.calls._M_t._M_impl.super__Rb_tree_header.
                                                   _M_node_count), bVar1) {
    pCVar5 = std::_Rb_tree_const_iterator<CfgData::Call>::operator*(&__end1);
    CfgData::Call::Call((Call *)local_80,pCVar5);
    sVar2 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::size
                      ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                        *)&call.block_addr);
    __return_storage_ptr__->calls = __return_storage_ptr__->calls + (int)sVar2;
    CfgData::Call::~Call((Call *)local_80);
    std::_Rb_tree_const_iterator<CfgData::Call>::operator++(&__end1);
  }
  sVar2 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::size
                    (&info->indirects);
  __return_storage_ptr__->indirects = __return_storage_ptr__->indirects + (int)sVar2;
  return __return_storage_ptr__;
}

Assistant:

SpecificStrategy::Stats SpecificStrategy::extractStats(const SpecificStrategy::Info& info) {
	Stats s;

	s.instrs = info.instrs.size();

	s.blocks.perfect = info.blocks.perfect.size();
	s.blocks.conflict = info.blocks.conflict.size();

	s.phantoms += info.phantoms.size();

	s.edges.internal.perfect = info.edges.internal.perfect.size();
	s.edges.internal.conflict = info.edges.internal.conflict.size();
	s.edges.external.perfect = info.edges.external.perfect.size();
	s.edges.external.conflict = info.edges.external.conflict.size();

	s.calls = 0;
	for (CfgData::Call call : info.calls)
		s.calls += call.calls.size();

	s.indirects += info.indirects.size();

	return s;
}